

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O0

string_type * booster::operator+(sub_match<const_char_*> *l,value_type *r)

{
  string_type *in_RDI;
  string_type *__lhs;
  string local_38 [16];
  sub_match<const_char_*> *in_stack_ffffffffffffffd8;
  
  __lhs = in_RDI;
  sub_match<char_const*>::str_abi_cxx11_(in_stack_ffffffffffffffd8);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

typename sub_match<Iterator>::string_type 
	operator+(sub_match<Iterator> const &l,typename sub_match<Iterator>::value_type const *r)
	{ return l.str() + r; }